

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arch.cpp
# Opt level: O2

Error asmjit::ArchUtils::typeIdToRegInfo(uint32_t archType,uint32_t *typeIdInOut,RegInfo *regInfo)

{
  byte bVar1;
  uint uVar2;
  uint32_t uVar3;
  ulong uVar4;
  ulong uStack_8;
  
  uVar2 = *typeIdInOut;
  uVar4 = (ulong)uVar2;
  regInfo->_signature = 0;
  if (2 < archType - 1) {
    return 5;
  }
  if (uVar2 < 0x20) {
    uVar4 = (ulong)(byte)x86OpData[uVar4 + 0xa0];
  }
  uVar2 = (uint)uVar4;
  if (0x44 < uVar2 - 0x20) {
    return 0x30;
  }
  if ((uVar2 & 0x7e) == 0x20) {
    if (uVar2 == 0x20) {
      uVar4 = (ulong)((archType != 1) + 0x26 + (uint)(archType != 1));
    }
    else {
      uVar4 = (ulong)((archType != 1) + 0x27 + (uint)(archType != 1));
    }
  }
  uVar3 = (uint32_t)uVar4;
  bVar1 = TypeId::_info[uVar4];
  if (bVar1 == 0) {
    return 0x30;
  }
  switch(uVar3) {
  case 0x22:
  case 0x23:
    uStack_8 = 2;
    break;
  case 0x24:
  case 0x25:
    uStack_8 = 4;
    break;
  case 0x26:
  case 0x27:
    uStack_8 = 5;
    break;
  case 0x28:
  case 0x29:
    if (archType == 1) {
      return 0x32;
    }
    uStack_8 = 6;
    break;
  case 0x2a:
    uVar3 = 0x3b;
    goto LAB_0016e590;
  case 0x2b:
    uVar3 = 0x46;
LAB_0016e590:
    uStack_8 = 9;
    break;
  case 0x2c:
    return 0x33;
  case 0x2d:
  case 0x2e:
  case 0x2f:
  case 0x30:
    uStack_8 = 0x12;
    break;
  case 0x31:
  case 0x32:
    uStack_8 = 0x11;
    break;
  default:
    if (bVar1 < 0x11) {
      uStack_8 = 9;
    }
    else {
      uStack_8 = (ulong)(bVar1 == 0x20) ^ 0xb;
    }
  }
  *typeIdInOut = uVar3;
  regInfo->_signature = *(uint32_t *)(x86OpData + uStack_8 * 4);
  return 0;
}

Assistant:

ASMJIT_FAVOR_SIZE Error ArchUtils::typeIdToRegInfo(uint32_t archType, uint32_t& typeIdInOut, RegInfo& regInfo) noexcept {
  uint32_t typeId = typeIdInOut;

  // Zero the signature so it's clear in case that typeId is not invalid.
  regInfo._signature = 0;

#if defined(ASMJIT_BUILD_X86)
  if (ArchInfo::isX86Family(archType)) {
    // Passed RegType instead of TypeId?
    if (typeId <= Reg::kRegMax)
      typeId = x86OpData.archRegs.regTypeToTypeId[typeId];

    if (ASMJIT_UNLIKELY(!TypeId::isValid(typeId)))
      return DebugUtils::errored(kErrorInvalidTypeId);

    // First normalize architecture dependent types.
    if (TypeId::isAbstract(typeId)) {
      if (typeId == TypeId::kIntPtr)
        typeId = (archType == ArchInfo::kTypeX86) ? TypeId::kI32 : TypeId::kI64;
      else
        typeId = (archType == ArchInfo::kTypeX86) ? TypeId::kU32 : TypeId::kU64;
    }

    // Type size helps to construct all kinds of registers. If the size is zero
    // then the TypeId is invalid.
    uint32_t size = TypeId::sizeOf(typeId);
    if (ASMJIT_UNLIKELY(!size))
      return DebugUtils::errored(kErrorInvalidTypeId);

    if (ASMJIT_UNLIKELY(typeId == TypeId::kF80))
      return DebugUtils::errored(kErrorInvalidUseOfF80);

    uint32_t regType = 0;

    switch (typeId) {
      case TypeId::kI8:
      case TypeId::kU8:
        regType = X86Reg::kRegGpbLo;
        break;

      case TypeId::kI16:
      case TypeId::kU16:
        regType = X86Reg::kRegGpw;
        break;

      case TypeId::kI32:
      case TypeId::kU32:
        regType = X86Reg::kRegGpd;
        break;

      case TypeId::kI64:
      case TypeId::kU64:
        if (archType == ArchInfo::kTypeX86)
          return DebugUtils::errored(kErrorInvalidUseOfGpq);

        regType = X86Reg::kRegGpq;
        break;

      // F32 and F64 are always promoted to use vector registers.
      case TypeId::kF32:
        typeId = TypeId::kF32x1;
        regType = X86Reg::kRegXmm;
        break;

      case TypeId::kF64:
        typeId = TypeId::kF64x1;
        regType = X86Reg::kRegXmm;
        break;

      // Mask registers {k}.
      case TypeId::kMask8:
      case TypeId::kMask16:
      case TypeId::kMask32:
      case TypeId::kMask64:
        regType = X86Reg::kRegK;
        break;

      // MMX registers.
      case TypeId::kMmx32:
      case TypeId::kMmx64:
        regType = X86Reg::kRegMm;
        break;

      // XMM|YMM|ZMM registers.
      default:
        if (size <= 16)
          regType = X86Reg::kRegXmm;
        else if (size == 32)
          regType = X86Reg::kRegYmm;
        else
          regType = X86Reg::kRegZmm;
        break;
    }

    typeIdInOut = typeId;
    regInfo._signature = x86OpData.archRegs.regInfo[regType].getSignature();
    return kErrorOk;
  }
#endif // ASMJIT_BUILD_X86

  return DebugUtils::errored(kErrorInvalidArch);
}